

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

Struct * __thiscall wasm::HeapType::getStruct(HeapType *this)

{
  ulong uVar1;
  
  uVar1 = this->id;
  if ((0x7c < uVar1) && (*(int *)(uVar1 + 0x30) == 2)) {
    if (0x7c < uVar1) {
      return (Struct *)(uVar1 + 0x38);
    }
    __assert_fail("!ht.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0xe6,"HeapTypeInfo *wasm::(anonymous namespace)::getHeapTypeInfo(HeapType)");
  }
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x39f,"const Struct &wasm::HeapType::getStruct() const");
}

Assistant:

const Struct& HeapType::getStruct() const {
  assert(isStruct());
  return getHeapTypeInfo(*this)->struct_;
}